

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O3

int pigpio_command(int fd,int command,int p1,int p2,int rl)

{
  ssize_t sVar1;
  cmdCmd_t cmd;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  local_1c = 0;
  local_28 = command;
  local_24 = p1;
  local_20 = p2;
  pthread_mutex_lock((pthread_mutex_t *)&command_mutex);
  sVar1 = send(fd,&local_28,0x10,0);
  if (sVar1 == 0x10) {
    sVar1 = recv(fd,&local_28,0x10,0x100);
    if (sVar1 == 0x10) {
      if (rl != 0) {
        pthread_mutex_unlock((pthread_mutex_t *)&command_mutex);
      }
    }
    else {
      pthread_mutex_unlock((pthread_mutex_t *)&command_mutex);
      local_1c = -0x7d1;
    }
  }
  else {
    pthread_mutex_unlock((pthread_mutex_t *)&command_mutex);
    local_1c = -2000;
  }
  return local_1c;
}

Assistant:

static int pigpio_command(int fd, int command, int p1, int p2, int rl)
{
   cmdCmd_t cmd;

   cmd.cmd = command;
   cmd.p1  = p1;
   cmd.p2  = p2;
   cmd.res = 0;

   pthread_mutex_lock(&command_mutex);

   if (send(fd, &cmd, sizeof(cmd), 0) != sizeof(cmd))
   {
      pthread_mutex_unlock(&command_mutex);
      return pigif_bad_send;
   }

   if (recv(fd, &cmd, sizeof(cmd), MSG_WAITALL) != sizeof(cmd))
   {
      pthread_mutex_unlock(&command_mutex);
      return pigif_bad_recv;
   }

   if (rl) pthread_mutex_unlock(&command_mutex);

   return cmd.res;
}